

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3RowSetTest(RowSet *pRowSet,u8 iBatch,sqlite3_int64 iRowid)

{
  RowSetEntry *pRVar1;
  RowSetEntry *pRVar2;
  RowSetEntry *pRVar3;
  RowSetEntry **ppRVar4;
  long lVar5;
  RowSetEntry *pAux;
  RowSetEntry *pTail;
  RowSetEntry *local_40;
  RowSetEntry *local_38;
  
  if (pRowSet->iBatch != iBatch) {
    pRVar1 = pRowSet->pEntry;
    if (pRVar1 != (RowSetEntry *)0x0) {
      ppRVar4 = &pRowSet->pForest;
      if ((pRowSet->rsFlags & 1) == 0) {
        pRVar1 = rowSetEntrySort(pRVar1);
      }
      if (*ppRVar4 != (RowSetEntry *)0x0) {
        pRVar3 = *ppRVar4;
        do {
          pRVar2 = pRVar3;
          if (pRVar2->pLeft == (RowSetEntry *)0x0) {
            pRVar1 = rowSetListToTree(pRVar1);
            pRVar2->pLeft = pRVar1;
            goto LAB_0016d97c;
          }
          rowSetTreeToList(pRVar2->pLeft,&local_40,&local_38);
          pRVar2->pLeft = (RowSetEntry *)0x0;
          pRVar1 = rowSetEntryMerge(local_40,pRVar1);
          pRVar3 = pRVar2->pRight;
        } while (pRVar2->pRight != (RowSetEntry *)0x0);
        ppRVar4 = &pRVar2->pRight;
      }
      pRVar3 = rowSetEntryAlloc(pRowSet);
      *ppRVar4 = pRVar3;
      if (pRVar3 != (RowSetEntry *)0x0) {
        pRVar3->v = 0;
        pRVar3->pRight = (RowSetEntry *)0x0;
        pRVar1 = rowSetListToTree(pRVar1);
        pRVar3->pLeft = pRVar1;
      }
LAB_0016d97c:
      pRowSet->pEntry = (RowSetEntry *)0x0;
      pRowSet->pLast = (RowSetEntry *)0x0;
      pRowSet->rsFlags = pRowSet->rsFlags | 1;
    }
    pRowSet->iBatch = iBatch;
  }
  pRVar1 = pRowSet->pForest;
  do {
    if (pRVar1 == (RowSetEntry *)0x0) {
      return 0;
    }
    for (pRVar3 = pRVar1->pLeft; pRVar3 != (RowSetEntry *)0x0;
        pRVar3 = *(RowSetEntry **)((long)&pRVar3->v + lVar5)) {
      lVar5 = 8;
      if ((iRowid <= pRVar3->v) && (lVar5 = 0x10, pRVar3->v <= iRowid)) {
        return 1;
      }
    }
    pRVar1 = pRVar1->pRight;
  } while( true );
}

Assistant:

SQLITE_PRIVATE int sqlite3RowSetTest(RowSet *pRowSet, u8 iBatch, sqlite3_int64 iRowid){
  struct RowSetEntry *p, *pTree;

  /* This routine is never called after sqlite3RowSetNext() */
  assert( pRowSet!=0 && (pRowSet->rsFlags & ROWSET_NEXT)==0 );

  /* Sort entries into the forest on the first test of a new batch 
  */
  if( iBatch!=pRowSet->iBatch ){
    p = pRowSet->pEntry;
    if( p ){
      struct RowSetEntry **ppPrevTree = &pRowSet->pForest;
      if( (pRowSet->rsFlags & ROWSET_SORTED)==0 ){
        p = rowSetEntrySort(p);
      }
      for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
        ppPrevTree = &pTree->pRight;
        if( pTree->pLeft==0 ){
          pTree->pLeft = rowSetListToTree(p);
          break;
        }else{
          struct RowSetEntry *pAux, *pTail;
          rowSetTreeToList(pTree->pLeft, &pAux, &pTail);
          pTree->pLeft = 0;
          p = rowSetEntryMerge(pAux, p);
        }
      }
      if( pTree==0 ){
        *ppPrevTree = pTree = rowSetEntryAlloc(pRowSet);
        if( pTree ){
          pTree->v = 0;
          pTree->pRight = 0;
          pTree->pLeft = rowSetListToTree(p);
        }
      }
      pRowSet->pEntry = 0;
      pRowSet->pLast = 0;
      pRowSet->rsFlags |= ROWSET_SORTED;
    }
    pRowSet->iBatch = iBatch;
  }

  /* Test to see if the iRowid value appears anywhere in the forest.
  ** Return 1 if it does and 0 if not.
  */
  for(pTree = pRowSet->pForest; pTree; pTree=pTree->pRight){
    p = pTree->pLeft;
    while( p ){
      if( p->v<iRowid ){
        p = p->pRight;
      }else if( p->v>iRowid ){
        p = p->pLeft;
      }else{
        return 1;
      }
    }
  }
  return 0;
}